

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

Aig_Man_t * Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *pLcr)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  Aig_Man_t *p;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  int local_48;
  int Offset;
  int c;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t **ppClass;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Fra_Lcr_t *pLcr_local;
  
  for (Offset = 0; iVar2 = Vec_PtrSize(pLcr->pAig->vCis), Offset < iVar2; Offset = Offset + 1) {
    plVar5 = (long *)Vec_PtrEntry(pLcr->pAig->vCis,Offset);
    plVar5[5] = (long)pLcr;
    *plVar5 = (long)Offset;
  }
  iVar2 = Aig_ManCoNum(pLcr->pAig);
  iVar3 = Aig_ManCiNum(pLcr->pAig);
  Aig_ManCleanData(pLcr->pAig);
  p = Aig_ManStartFrom(pLcr->pAig);
  for (Offset = 0; iVar4 = Vec_PtrSize(pLcr->pCla->vClasses), Offset < iVar4; Offset = Offset + 1) {
    pvVar6 = Vec_PtrEntry(pLcr->pCla->vClasses,Offset);
    _c = Aig_ManConst0(p);
    local_48 = 0;
    while (*(long *)((long)pvVar6 + (long)local_48 * 8) != 0) {
      iVar4 = Aig_ObjIsCi(*(Aig_Obj_t **)((long)pvVar6 + (long)local_48 * 8));
      if (iVar4 == 0) {
        __assert_fail("Aig_ObjIsCi(ppClass[c])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraLcr.c"
                      ,0x13e,"Aig_Man_t *Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *)");
      }
      pAVar7 = Aig_ManCo(pLcr->pAig,
                         (iVar2 - iVar3) + (int)**(undefined8 **)((long)pvVar6 + (long)local_48 * 8)
                        );
      pAVar1 = pLcr->pAig;
      pAVar7 = Aig_ObjFanin0(pAVar7);
      pAVar7 = Fra_LcrManDup_rec(p,pAVar1,pAVar7);
      _c = Aig_Exor(p,_c,pAVar7);
      local_48 = local_48 + 1;
    }
    Aig_ObjCreateCo(p,_c);
  }
  Offset = 0;
  while( true ) {
    iVar4 = Vec_PtrSize(pLcr->pCla->vClasses1);
    if (iVar4 <= Offset) {
      return p;
    }
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pLcr->pCla->vClasses1,Offset);
    iVar4 = Aig_ObjIsCi(pAVar7);
    if (iVar4 == 0) break;
    pAVar7 = Aig_ManCo(pLcr->pAig,(iVar2 - iVar3) + (pAVar7->field_0).CioId);
    pAVar1 = pLcr->pAig;
    pAVar7 = Aig_ObjFanin0(pAVar7);
    pAVar7 = Fra_LcrManDup_rec(p,pAVar1,pAVar7);
    Aig_ObjCreateCo(p,pAVar7);
    Offset = Offset + 1;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraLcr.c"
                ,0x148,"Aig_Man_t *Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *)");
}

Assistant:

Aig_Man_t * Fra_LcrDeriveAigForPartitioning( Fra_Lcr_t * pLcr )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjPo, * pObjNew, ** ppClass, * pMiter;
    int i, c, Offset;
    // remember the numbers of the inputs of the original AIG
    Aig_ManForEachCi( pLcr->pAig, pObj, i )
    {
        pObj->pData = pLcr;
        pObj->pNext = (Aig_Obj_t *)(long)i;
    }
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(pLcr->pAig) - Aig_ManCiNum(pLcr->pAig);
    // create the PIs
    Aig_ManCleanData( pLcr->pAig );
    pNew = Aig_ManStartFrom( pLcr->pAig );
    // go over the equivalence classes
    Vec_PtrForEachEntry( Aig_Obj_t **, pLcr->pCla->vClasses, ppClass, i )
    {
        pMiter = Aig_ManConst0(pNew);
        for ( c = 0; ppClass[c]; c++ )
        {
            assert( Aig_ObjIsCi(ppClass[c]) );
            pObjPo  = Aig_ManCo( pLcr->pAig, Offset+(long)ppClass[c]->pNext );
            pObjNew = Fra_LcrManDup_rec( pNew, pLcr->pAig, Aig_ObjFanin0(pObjPo) );
            pMiter  = Aig_Exor( pNew, pMiter, pObjNew );
        }
        Aig_ObjCreateCo( pNew, pMiter );
    }
    // go over the constant candidates
    Vec_PtrForEachEntry( Aig_Obj_t *, pLcr->pCla->vClasses1, pObj, i )
    {
        assert( Aig_ObjIsCi(pObj) );
        pObjPo = Aig_ManCo( pLcr->pAig, Offset+(long)pObj->pNext );
        pMiter = Fra_LcrManDup_rec( pNew, pLcr->pAig, Aig_ObjFanin0(pObjPo) );
        Aig_ObjCreateCo( pNew, pMiter );
    }
    return pNew;
}